

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

void __thiscall xercesc_4_0::CMStateSet::allocateChunk(CMStateSet *this,XMLSize_t index)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLSize_t index_local;
  CMStateSet *this_local;
  undefined8 local_20;
  undefined8 local_18;
  CMStateSet *local_10;
  
  if ((XMLPlatformUtils::fgSSE2ok & 1) == 0) {
    pMVar1 = this->fDynamicBuffer->fMemoryManager;
    iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x80);
    this->fDynamicBuffer->fBitArray[index] = (XMLInt32 *)CONCAT44(extraout_var,iVar2);
  }
  else {
    local_18 = 0x80;
    local_20 = 0x10;
    iVar2 = posix_memalign(&this_local,0x10,0x80);
    if (iVar2 == 0) {
      local_10 = this_local;
    }
    else {
      local_10 = (CMStateSet *)0x0;
    }
    this->fDynamicBuffer->fBitArray[index] = (XMLInt32 *)local_10;
  }
  return;
}

Assistant:

void allocateChunk(const XMLSize_t index)
    {
#ifdef XERCES_HAVE_SSE2_INTRINSIC
        if(XMLPlatformUtils::fgSSE2ok)
            fDynamicBuffer->fBitArray[index]=(XMLInt32*)_mm_malloc(CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32), 16);
        else
#endif
            fDynamicBuffer->fBitArray[index]=(XMLInt32*)fDynamicBuffer->fMemoryManager->allocate(CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
    }